

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsOF.c
# Opt level: O0

void JsObjectProtoIsPrototypeOfCall
               (JsObject *obj,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  JsObject *local_38;
  JsObject *prototype;
  JsValue *res_local;
  JsValue **argv_local;
  int argc_local;
  JsObject *thisobj_local;
  JsObject *obj_local;
  
  res->type = JS_BOOLEAN;
  if (argc < 1) {
    (res->u).boolean = 0;
  }
  else if ((*argv)->type == JS_OBJECT) {
    for (local_38 = (((*argv)->u).object)->Prototype; local_38 != (JsObject *)0x0;
        local_38 = local_38->Prototype) {
      if (local_38 == thisobj) {
        res->type = JS_BOOLEAN;
        (res->u).boolean = 1;
        return;
      }
    }
    res->type = JS_BOOLEAN;
    (res->u).boolean = 0;
  }
  else {
    res->type = JS_BOOLEAN;
    (res->u).boolean = 0;
  }
  return;
}

Assistant:

static void JsObjectProtoIsPrototypeOfCall(struct JsObject *obj, struct JsObject *thisobj,
			int argc, struct JsValue **argv, struct JsValue *res){
	struct JsObject* prototype;
	
	res->type = JS_BOOLEAN;
	if(argc <= 0){
		res->u.boolean = FALSE;
		return;
	}
	if(argv[0]->type != JS_OBJECT){
		res->type = JS_BOOLEAN;
		res->u.boolean = FALSE;
		return ;
	}
	prototype = argv[0]->u.object->Prototype;
	//循环查询
	while(prototype != NULL){
		if(prototype == thisobj){
			res->type = JS_BOOLEAN;
			res->u.boolean = TRUE;
			return;
		}
		//下一个对象的原形
		prototype = prototype->Prototype;
	}
	//没有查询到
	res->type = JS_BOOLEAN;
	res->u.boolean = FALSE;
}